

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2protocolhandler.cpp
# Opt level: O2

void __thiscall
QHttp2ProtocolHandler::connectionError
          (QHttp2ProtocolHandler *this,Http2Error errorCode,QString *message)

{
  QHttpNetworkConnectionChannel *this_00;
  NetworkError error;
  QLoggingCategory *pQVar1;
  QDebug *this_01;
  char *message_00;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_58;
  char *local_40;
  QDebug local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = QtPrivateLogging::QT_HTTP2();
  if (((pQVar1->field_2).bools.enabledCritical._q_value._M_base._M_i & 1U) != 0) {
    local_40 = pQVar1->name;
    local_58.d._0_4_ = 2;
    local_58.d._4_4_ = 0;
    local_58.ptr._0_4_ = 0;
    local_58.ptr._4_4_ = 0;
    local_58.size._0_4_ = 0;
    local_58.size._4_4_ = 0;
    QMessageLogger::critical();
    this_01 = QDebug::operator<<(&local_38,"connection error:");
    QDebug::operator<<(this_01,message);
    QDebug::~QDebug(&local_38);
  }
  error = Http2::qt_error(errorCode);
  this_00 = *(QHttpNetworkConnectionChannel **)(this + 0x18);
  QString::toLocal8Bit((QByteArray *)&local_58,message);
  message_00 = (char *)CONCAT44(local_58.ptr._4_4_,local_58.ptr._0_4_);
  if (message_00 == (char *)0x0) {
    message_00 = (char *)&QByteArray::_empty;
  }
  QHttpNetworkConnectionChannel::emitFinishedWithError(this_00,error,message_00);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
  closeSession(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttp2ProtocolHandler::connectionError(Http2::Http2Error errorCode, const QString &message)
{
    Q_ASSERT(!message.isNull());

    qCCritical(QT_HTTP2) << "connection error:" << message;

    const auto error = qt_error(errorCode);
    m_channel->emitFinishedWithError(error, qPrintable(message));

    closeSession();
}